

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zvgPort.c
# Opt level: O2

uint zvgGetDeviceID(uchar *ss,uint idLen,uint *aReadLen)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined8 in_RAX;
  uint uVar4;
  long lVar5;
  uint uVar6;
  uchar countLSB;
  uchar countMSB;
  uint local_34;
  
  _countLSB = (ushort)((ulong)in_RAX >> 0x10) & 0xff00;
  if ((ZvgIO.ecpFlags & 1) != 0) {
    terminate_1284();
  }
  uVar2 = 0x13;
  if ((1 < idLen) && (((ZvgIO.ecpFlags & 2) != 0 || (uVar2 = negotiate_1284('\x04'), uVar2 == 0))))
  {
    ZvgIO.ecpFlags = ZvgIO.ecpFlags | 2;
    uVar2 = getByteNb(&countMSB);
    if ((uVar2 == 0) && (uVar2 = getByteNb(&countLSB), uVar2 == 0)) {
      if (_countLSB < 3) {
        terminate_1284();
        *ss = '\0';
        *aReadLen = 0;
        uVar2 = 0x13;
      }
      else {
        uVar3 = _countLSB - 2;
        uVar6 = idLen - 1;
        if (uVar3 < idLen - 1) {
          uVar6 = uVar3;
        }
        lVar5 = 0;
        local_34 = uVar6;
        while (((uVar4 = (uint)lVar5, uVar3 = local_34, uVar2 = 0, uVar6 != uVar4 &&
                (bVar1 = in((undefined2)ZvgIO.ecpDsr), uVar3 = uVar4, uVar2 = 0, (bVar1 & 8) == 0))
               && (uVar2 = getByteNb(ss + lVar5), uVar2 == 0))) {
          lVar5 = lVar5 + 1;
        }
        ss[lVar5] = '\0';
        *aReadLen = uVar3;
        zvgSetSppMode();
      }
    }
  }
  return uVar2;
}

Assistant:

uint zvgGetDeviceID( uchar *ss, uint idLen, uint *aReadLen)
{
	uint	err, count, readLen;
	uchar	countMSB, countLSB=0;

	// if in ECP mode, terminate first

	if (ZvgIO.ecpFlags & ECPF_ECP)
		terminate_1284();

	if (idLen < 2)
		return (errEcpNoData);				// no room in buffer

	// do a REQ for ID using NIBBLE mode

	if (!(ZvgIO.ecpFlags & ECPF_NIBBLE))
		if ((err = (negotiate_1284( EMODE_REQID_NIBBLE))) != errOk)
			return (err);

	// up to us to set the flag

	ZvgIO.ecpFlags |= ECPF_NIBBLE;		// indicate nibble mode

	// get count word

	err = getByteNb( &countMSB);			// get a byte using nibble mode

	if (!err)
		err = getByteNb( &countLSB);

	// check for error reading first two bytes

	if (err)
		return (err);

	count = (countMSB << 8) + countLSB;

	if (count <= 2)
	{	terminate_1284();
		*ss = '\0';
		*aReadLen = 0;
		return (errEcpNoData);				// no proper ID is given
	}

	count -= 2;									// get number of bytes to read

	// check if it will fit in buffer, leave room for trailing '\0'

	if (count > idLen - 1)
		count = idLen - 1;

	readLen = 0;

	// read string of length 'count' from peripheral using the NIBBLE mode

	while (readLen < count && isDataAvail())
	{
		err = getByteNb( ss);

		if (err)
			break;

		ss++;
		readLen++;
	}
	*ss = '\0';
	*aReadLen = readLen;

	// switch to SPP mode (if not already there because of error)

	zvgSetSppMode();
	return (err);
}